

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O1

bool __thiscall
beast::unit_test::runner::run_each<beast::unit_test::suite_list>(runner *this,suite_list *c)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  p_Var2 = (c->
           super_const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
           ).m_cont._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(c->
            super_const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
            ).m_cont._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      bVar1 = run<void>(this,(suite_info *)(p_Var2 + 1));
      bVar4 = (bool)(bVar4 | bVar1);
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return bVar4;
}

Assistant:

bool
runner::run_each(SequenceContainer const& c)
{
    bool failed(false);
    for(auto const& s : c)
        failed = run(s) || failed;
    return failed;
}